

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssutil.cpp
# Opt level: O1

char * strtoupper(char *str)

{
  int iVar1;
  
  iVar1 = toupper((int)*str);
  *str = (char)iVar1;
  return str;
}

Assistant:

char* strtoupper(char* str)
{
    char* p = str;

    *p = toupper(*p);
    while (*p)
        p++;

    return str;
}